

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O1

void __thiscall
trng::correlated_normal_dist<double>::param_type::param_type<double_const*>
          (param_type *this,double *first,double *last)

{
  iterator __position;
  ulong uVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = (double)((long)last - (long)first >> 3);
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->d_ = 0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  this->d_ = uVar1;
  std::vector<double,_std::allocator<double>_>::reserve(&this->H_,uVar1 * uVar1);
  if (this->d_ * this->d_ != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      __position._M_current =
           (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)this,__position,
                   (double *)((long)first + lVar2));
      }
      else {
        *__position._M_current = first[uVar1];
        (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar1 < this->d_ * this->d_);
  }
  Cholesky_factorization(this);
  return;
}

Assistant:

explicit param_type(iter first, iter last) {
        d_ = static_cast<size_type>(
            trng::math::sqrt(static_cast<result_type>(std::distance(first, last))));
        H_.reserve(d_ * d_);
        for (size_type i{0}; i < d_ * d_; ++i, ++first)
          H_.push_back(*first);
        Cholesky_factorization();
      }